

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O1

bool Imath_2_5::extractAndRemoveScalingAndShear<float>
               (Matrix33<float> *mat,Vec2<float> *scl,float *shr,bool exc)

{
  float *scl_00;
  Vec2<float> VVar1;
  int i;
  Vec2<float> *pVVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float maxVal;
  float local_5c;
  Vec2<float> local_58 [2];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_58[0].x = *(float *)((long)(mat->x + 0) + 0);
  local_58[0].y = *(float *)((long)(mat->x + 0) + 4);
  local_58[1].x = *(float *)((long)(mat->x + 1) + 0);
  local_58[1].y = *(float *)((long)(mat->x + 1) + 4);
  local_5c = 0.0;
  pVVar2 = local_58;
  lVar4 = 0;
  do {
    lVar3 = 0;
    fVar8 = local_5c;
    do {
      local_5c = (&pVVar2->x)[lVar3];
      if (local_5c <= -local_5c) {
        local_5c = -local_5c;
      }
      if (local_5c <= fVar8) {
        local_5c = fVar8;
      }
      lVar3 = lVar3 + 1;
      fVar8 = local_5c;
    } while (lVar3 == 1);
    pVVar2 = pVVar2 + 1;
    bVar5 = lVar4 == 0;
    lVar4 = lVar4 + 1;
  } while (bVar5);
  if ((local_5c != 0.0) || (NAN(local_5c))) {
    lVar4 = 0;
    do {
      bVar5 = checkForZeroScaleInRow<float>
                        (&local_5c,(Vec2<float> *)((long)&local_58[0].x + lVar4),exc);
      if (!bVar5) {
        return false;
      }
      auVar10._8_8_ = 0;
      auVar10._0_8_ = *(ulong *)((long)&local_58[0].x + lVar4);
      auVar11._4_4_ = local_5c;
      auVar11._0_4_ = local_5c;
      auVar11._8_8_ = 0;
      auVar11 = divps(auVar10,auVar11);
      *(long *)((long)&local_58[0].x + lVar4) = auVar11._0_8_;
      lVar4 = lVar4 + 8;
    } while (lVar4 == 8);
  }
  fVar14 = local_58[0].x;
  fVar15 = local_58[0].y;
  fVar8 = fVar14 * fVar14 + fVar15 * fVar15;
  if (2.3509887e-38 <= fVar8) {
    if (fVar8 < 0.0) {
      fVar8 = sqrtf(fVar8);
    }
    else {
      fVar8 = SQRT(fVar8);
    }
  }
  else {
    uVar6 = -(uint)(fVar14 < -fVar14);
    uVar7 = -(uint)(fVar15 < -fVar15);
    fVar9 = (float)(~uVar6 & (uint)fVar14 | (uint)-fVar14 & uVar6);
    fVar15 = (float)(~uVar7 & (uint)fVar15 | (uint)-fVar15 & uVar7);
    fVar14 = fVar15;
    if (fVar15 <= fVar9) {
      fVar14 = fVar9;
    }
    fVar8 = 0.0;
    if ((fVar14 != 0.0) || (NAN(fVar14))) {
      fVar8 = (fVar9 / fVar14) * (fVar9 / fVar14) + (fVar15 / fVar14) * (fVar15 / fVar14);
      if (fVar8 < 0.0) {
        local_48 = fVar14;
        fStack_44 = fVar15;
        fStack_40 = fVar15;
        fStack_3c = fVar15;
        fVar8 = sqrtf(fVar8);
        fVar14 = local_48;
      }
      else {
        fVar8 = SQRT(fVar8);
      }
      fVar8 = fVar14 * fVar8;
    }
  }
  scl->x = fVar8;
  bVar5 = checkForZeroScaleInRow<float>(&scl->x,local_58,exc);
  if (bVar5) {
    fVar8 = scl->x;
    auVar12._4_4_ = fVar8;
    auVar12._0_4_ = fVar8;
    auVar12._8_4_ = fVar8;
    auVar12._12_4_ = fVar8;
    auVar17._8_8_ = 0;
    auVar17._0_4_ = local_58[0].x;
    auVar17._4_4_ = local_58[0].y;
    auVar11 = divps(auVar17,auVar12);
    local_58[0] = auVar11._0_8_;
    fVar8 = auVar11._0_4_ * local_58[1].x + auVar11._4_4_ * local_58[1].y;
    *shr = fVar8;
    fVar14 = local_58[1].x - fVar8 * auVar11._0_4_;
    fVar15 = local_58[1].y - fVar8 * auVar11._4_4_;
    local_58[1] = (Vec2<float>)CONCAT44(fVar15,fVar14);
    fVar8 = fVar14 * fVar14 + fVar15 * fVar15;
    if (2.3509887e-38 <= fVar8) {
      if (fVar8 < 0.0) {
        fVar8 = sqrtf(fVar8);
      }
      else {
        fVar8 = SQRT(fVar8);
      }
    }
    else {
      uVar6 = -(uint)(fVar14 < -fVar14);
      uVar7 = -(uint)(fVar15 < -fVar15);
      fVar9 = (float)(~uVar6 & (uint)fVar14 | (uint)-fVar14 & uVar6);
      fVar15 = (float)(~uVar7 & (uint)fVar15 | (uint)-fVar15 & uVar7);
      fVar14 = fVar15;
      if (fVar15 <= fVar9) {
        fVar14 = fVar9;
      }
      fVar8 = 0.0;
      if ((fVar14 != 0.0) || (NAN(fVar14))) {
        fVar8 = (fVar9 / fVar14) * (fVar9 / fVar14) + (fVar15 / fVar14) * (fVar15 / fVar14);
        if (fVar8 < 0.0) {
          local_48 = fVar14;
          fStack_44 = fVar15;
          fStack_40 = fVar15;
          fStack_3c = fVar15;
          fVar8 = sqrtf(fVar8);
          fVar14 = local_48;
        }
        else {
          fVar8 = SQRT(fVar8);
        }
        fVar8 = fVar14 * fVar8;
      }
    }
    scl_00 = &scl->y;
    scl->y = fVar8;
    bVar5 = checkForZeroScaleInRow<float>(scl_00,local_58 + 1,exc);
    if (bVar5) {
      fVar8 = *scl_00;
      auVar13._8_8_ = 0;
      auVar13._0_4_ = local_58[1].x;
      auVar13._4_4_ = local_58[1].y;
      auVar18._4_4_ = fVar8;
      auVar18._0_4_ = fVar8;
      auVar18._8_4_ = fVar8;
      auVar18._12_4_ = fVar8;
      auVar11 = divps(auVar13,auVar18);
      uVar16 = auVar11._0_8_;
      local_58[1].x = (float)(int)uVar16;
      local_58[1].y = (float)(int)(uVar16 >> 0x20);
      *shr = *shr / fVar8;
      if (auVar11._4_4_ * local_58[0].x - local_58[0].y * auVar11._0_4_ < 0.0) {
        local_58[1].x = (float)(int)(uVar16 ^ 0x8000000080000000);
        local_58[1].y = (float)(int)((uVar16 ^ 0x8000000080000000) >> 0x20);
        *scl_00 = -*scl_00;
        *shr = -*shr;
      }
      lVar4 = 0;
      do {
        fVar8 = local_58[lVar4].y;
        *(float *)((long)mat + 0) = local_58[lVar4].x;
        *(float *)((long)mat + 4) = fVar8;
        lVar4 = lVar4 + 1;
        mat = (Matrix33<float> *)((long)mat + 0xc);
      } while (lVar4 == 1);
      VVar1.y = local_5c * (*scl).y;
      VVar1.x = local_5c * (*scl).x;
      *scl = VVar1;
      return true;
    }
  }
  return false;
}

Assistant:

bool
extractAndRemoveScalingAndShear (Matrix33<T> &mat, 
				 Vec2<T> &scl, T &shr, bool exc)
{
    Vec2<T> row[2];

    row[0] = Vec2<T> (mat[0][0], mat[0][1]);
    row[1] = Vec2<T> (mat[1][0], mat[1][1]);
    
    T maxVal = 0;
    for (int i=0; i < 2; i++)
	for (int j=0; j < 2; j++)
	    if (IMATH_INTERNAL_NAMESPACE::abs (row[i][j]) > maxVal)
		maxVal = IMATH_INTERNAL_NAMESPACE::abs (row[i][j]);

    //
    // We normalize the 2x2 matrix here.
    // It was noticed that this can improve numerical stability significantly,
    // especially when many of the upper 2x2 matrix's coefficients are very
    // close to zero; we correct for this step at the end by multiplying the 
    // scaling factors by maxVal at the end (shear and rotation are not 
    // affected by the normalization).

    if (maxVal != 0)
    {
	for (int i=0; i < 2; i++)
	    if (! checkForZeroScaleInRow (maxVal, row[i], exc))
		return false;
	    else
		row[i] /= maxVal;
    }

    // Compute X scale factor. 
    scl.x = row[0].length ();
    if (! checkForZeroScaleInRow (scl.x, row[0], exc))
	return false;

    // Normalize first row.
    row[0] /= scl.x;

    // An XY shear factor will shear the X coord. as the Y coord. changes.
    // There are 2 combinations (XY, YX), although we only extract the XY 
    // shear factor because we can effect the an YX shear factor by 
    // shearing in XY combined with rotations and scales.
    //
    // shear matrix <   1,  YX,  0,
    //                 XY,   1,  0,
    //                  0,   0,  1 >

    // Compute XY shear factor and make 2nd row orthogonal to 1st.
    shr     = row[0].dot (row[1]);
    row[1] -= shr * row[0];

    // Now, compute Y scale.
    scl.y = row[1].length ();
    if (! checkForZeroScaleInRow (scl.y, row[1], exc))
	return false;

    // Normalize 2nd row and correct the XY shear factor for Y scaling.
    row[1] /= scl.y; 
    shr    /= scl.y;

    // At this point, the upper 2x2 matrix in mat is orthonormal.
    // Check for a coordinate system flip. If the determinant
    // is -1, then flip the rotation matrix and adjust the scale(Y) 
    // and shear(XY) factors to compensate.
    if (row[0][0] * row[1][1] - row[0][1] * row[1][0] < 0)
    {
	row[1][0] *= -1;
	row[1][1] *= -1;
	scl[1] *= -1;
	shr *= -1;
    }

    // Copy over the orthonormal rows into the returned matrix.
    // The upper 2x2 matrix in mat is now a rotation matrix.
    for (int i=0; i < 2; i++)
    {
	mat[i][0] = row[i][0]; 
	mat[i][1] = row[i][1]; 
    }

    scl *= maxVal;

    return true;
}